

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::php::anon_unknown_2::GenerateMessageFile
          (anon_unknown_2 *this,FileDescriptor *file,Descriptor *message,Options *options,
          GeneratorContext *generator_context)

{
  FieldDescriptor *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  once_flag *__once;
  Options *options_00;
  bool bVar3;
  byte bVar4;
  long lVar5;
  long extraout_RAX;
  ZeroCopyOutputStream *pZVar6;
  byte bVar7;
  ulong uVar8;
  Printer *options_01;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *pFVar9;
  long lVar10;
  char *pcVar11;
  int indentCount;
  long lVar12;
  string filename;
  Printer printer_1;
  string filename_1;
  string php_namespace;
  string fullname;
  Printer printer;
  string base;
  string newname;
  string metadata_fullname;
  string metadata_filename;
  string local_2a0;
  undefined1 local_280 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  undefined1 local_248 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230 [3];
  string local_1e0;
  undefined1 local_1c0 [32];
  ZeroCopyOutputStream *local_1a0;
  string local_198;
  string local_178;
  Options *local_158;
  Printer local_150;
  undefined1 *local_b0;
  ZeroCopyOutputStream *local_a8;
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  indentCount = (int)generator_context;
  if (*(char *)(*(long *)(file + 0x20) + 0x4b) == '\0') {
    FullClassName<google::protobuf::Descriptor>
              ((string *)local_280,(Descriptor *)file,(Options *)message);
    if ((ZeroCopyOutputStream *)local_280._8_8_ != (ZeroCopyOutputStream *)0x0) {
      pZVar6 = (ZeroCopyOutputStream *)0x0;
      do {
        if (*(char *)(local_280._0_8_ + (long)pZVar6) == '\\') {
          *(char *)(local_280._0_8_ + (long)pZVar6) = '/';
        }
        pZVar6 = (ZeroCopyOutputStream *)((long)&pZVar6->_vptr_ZeroCopyOutputStream + 1);
      } while (pZVar6 < (ulong)local_280._8_8_);
    }
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,local_280._0_8_,
               (pointer)(local_280._0_8_ + (long)(_func_int ***)local_280._8_8_));
    std::__cxx11::string::append((char *)&local_2a0);
    if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
      operator_delete((void *)local_280._0_8_);
    }
    local_1a0 = (ZeroCopyOutputStream *)(**(code **)(*(long *)options + 0x10))(options,&local_2a0);
    io::Printer::Printer(&local_150,local_1a0,'^');
    io::Printer::Print<char[9],std::__cxx11::string>
              (&local_150,
               "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
               ,(char (*) [9])"filename",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this);
    FilenameToClassname(&local_178,&local_2a0);
    lVar5 = std::__cxx11::string::find_last_of((char *)&local_178,0x3e4bdf,0xffffffffffffffff);
    if (lVar5 << 0x20 != -0x100000000) {
      std::__cxx11::string::substr((ulong)local_280,(ulong)&local_178);
      io::Printer::Print<char[5],std::__cxx11::string>
                (&local_150,"namespace ^name^;\n\n",(char (*) [5])0x3f58c9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280);
      if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
        operator_delete((void *)local_280._0_8_);
      }
    }
    pcVar11 = 
    "use Google\\Protobuf\\Internal\\GPBType;\nuse Google\\Protobuf\\Internal\\RepeatedField;\nuse Google\\Protobuf\\Internal\\GPBUtil;\n\n"
    ;
    if (*message != (Descriptor)0x0) {
      pcVar11 = 
      "use Google\\Protobuf\\Internal\\GPBType;\nuse Google\\Protobuf\\Internal\\GPBWire;\nuse Google\\Protobuf\\Internal\\RepeatedField;\nuse Google\\Protobuf\\Internal\\InputStream;\nuse Google\\Protobuf\\Internal\\GPBUtil;\n\n"
      ;
    }
    io::Printer::Print<>(&local_150,pcVar11);
    io::Printer::Print<>(&local_150,"/**\n");
    local_280._16_8_ = &local_260;
    local_280._24_8_ = 0;
    local_260._M_local_buf[0] = '\0';
    local_250._M_p = local_248 + 8;
    local_248._0_8_ = 0;
    local_248[8] = '\0';
    local_230[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_230[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_230[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = Descriptor::GetSourceLocation((Descriptor *)file,(SourceLocation *)local_280);
    if (bVar3) {
      GenerateDocCommentBodyForLocation
                ((anon_unknown_2 *)&local_150,(Printer *)local_280,(SourceLocation *)0x1,false,
                 indentCount);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_230);
    if (local_250._M_p != local_248 + 8) {
      operator_delete(local_250._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._16_8_ != &local_260) {
      operator_delete((void *)local_280._16_8_);
    }
    FullClassName<google::protobuf::Descriptor>(&local_1e0,(Descriptor *)file,(Options *)message);
    EscapePhpdoc((string *)local_280,&local_1e0);
    EscapePhpdoc((string *)local_1c0,(string *)(*(long *)(file + 8) + 0x20));
    io::Printer::Print<char[9],std::__cxx11::string,char[12],std::__cxx11::string>
              (&local_150," * Generated from protobuf message <code>^messagename^</code>\n */\n",
               (char (*) [9])"fullname",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
               (char (*) [12])"messagename",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0);
    if ((FieldDescriptor *)local_1c0._0_8_ != (FieldDescriptor *)(local_1c0 + 0x10)) {
      operator_delete((void *)local_1c0._0_8_);
    }
    if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
      operator_delete((void *)local_280._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    if (lVar5 << 0x20 != -0x100000000) {
      std::__cxx11::string::substr((ulong)local_280,(ulong)&local_178);
      std::__cxx11::string::operator=((string *)&local_178,(string *)local_280);
      if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
        operator_delete((void *)local_280._0_8_);
      }
    }
    local_b0 = local_a0;
    local_a8 = (ZeroCopyOutputStream *)0x0;
    local_a0[0] = 0;
    bVar4 = (byte)file[1] >> 2 & 0x1f;
    if (bVar4 == 10) {
      pcVar11 = "\\Google\\Protobuf\\Internal\\AnyBase";
    }
    else if (bVar4 == 0xd) {
      pcVar11 = "\\Google\\Protobuf\\Internal\\TimestampBase";
    }
    else {
      pcVar11 = "\\Google\\Protobuf\\Internal\\Message";
    }
    local_158 = options;
    std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)0x0,(ulong)pcVar11);
    pcVar11 = "name";
    options_01 = (Printer *)&local_b0;
    io::Printer::Print<char[5],std::__cxx11::string,char[5],std::__cxx11::string>
              (&local_150,"class ^name^ extends ^base^\n{\n",(char (*) [5])"base",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)options_01,
               (char (*) [5])0x3f58c9,&local_178);
    io::Printer::Indent(&local_150);
    io::Printer::Indent(&local_150);
    if (0 < *(int *)(file + 4)) {
      lVar10 = 0;
      lVar12 = 0;
      lVar5 = extraout_RAX;
      pFVar9 = extraout_RDX;
      do {
        lVar2 = *(long *)(file + 0x28);
        this_00 = (FieldDescriptor *)(lVar2 + lVar10);
        bVar4 = *(byte *)(lVar2 + 1 + lVar10);
        uVar8 = CONCAT71((int7)((ulong)lVar5 >> 8),bVar4) & 0xffffffff;
        bVar7 = ~(byte)uVar8;
        options_01 = (Printer *)CONCAT71((int7)(uVar8 >> 8),bVar7);
        if ((bVar7 & 0x60) == 0) {
          GenerateFieldDocComment(&local_150,this_00,(Options *)message,3);
          options_01 = *(Printer **)(lVar2 + 8 + lVar10);
          io::Printer::Print<char[5],std::__cxx11::string>
                    (&local_150,"private $^name^;\n",(char (*) [5])0x3f58c9,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)options_01
                    );
          pFVar9 = extraout_RDX_00;
        }
        else if ((((bVar4 & 0x10) == 0) || (lVar5 = *(long *)(lVar2 + 0x28 + lVar10), lVar5 == 0))
                || ((*(int *)(lVar5 + 4) == 1 && ((*(byte *)(*(long *)(lVar5 + 0x20) + 1) & 2) != 0)
                    ))) {
          __once = *(once_flag **)(lVar2 + 0x18 + lVar10);
          if (__once != (once_flag *)0x0) {
            local_1e0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
            local_1c0._0_8_ = this_00;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (__once,(_func_void_FieldDescriptor_ptr **)&local_1e0,
                       (FieldDescriptor **)local_1c0);
            pFVar9 = extraout_RDX_01;
          }
          if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                       (ulong)*(byte *)(lVar2 + 2 + lVar10) * 4) == 10) ||
             ((((*(byte *)(lVar2 + 1 + lVar10) & 0x10) != 0 &&
               (*(long *)(lVar2 + 0x28 + lVar10) != 0)) ||
              (*(char *)(*(long *)(lVar2 + 0x10 + lVar10) + 0x3a) == '\x02')))) {
            local_280._0_8_ = local_280 + 0x10;
            local_280._8_8_ = (ZeroCopyOutputStream *)0x4;
            local_280._16_5_ = 0x6c6c756e;
          }
          else {
            (anonymous_namespace)::DefaultForField_abi_cxx11_
                      ((string *)local_280,(_anonymous_namespace_ *)this_00,pFVar9);
          }
          GenerateFieldDocComment(&local_150,this_00,(Options *)message,3);
          options_01 = *(Printer **)(lVar2 + 8 + lVar10);
          pcVar11 = "initial_value";
          io::Printer::Print<char[5],std::__cxx11::string,char[14],std::__cxx11::string>
                    (&local_150,"protected $^name^ = ^initial_value^;\n",(char (*) [5])0x3f58c9,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)options_01
                     ,(char (*) [14])"initial_value",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280)
          ;
          pFVar9 = extraout_RDX_02;
          if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
            operator_delete((void *)local_280._0_8_);
            pFVar9 = extraout_RDX_03;
          }
        }
        lVar12 = lVar12 + 1;
        lVar5 = (long)*(int *)(file + 4);
        lVar10 = lVar10 + 0x48;
      } while (lVar12 < lVar5);
    }
    if (0 < *(int *)(file + 0x6c)) {
      lVar10 = 8;
      lVar5 = 0;
      do {
        options_01 = *(Printer **)(*(long *)(file + 0x30) + lVar10);
        io::Printer::Print<char[5],std::__cxx11::string>
                  (&local_150,"protected $^name^;\n",(char (*) [5])0x3f58c9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)options_01);
        lVar5 = lVar5 + 1;
        lVar10 = lVar10 + 0x28;
      } while (lVar5 < *(int *)(file + 0x6c));
    }
    io::Printer::Print<>(&local_150,"\n");
    io::Printer::Print<>(&local_150,"/**\n");
    io::Printer::Print<>(&local_150," * Constructor.\n");
    io::Printer::Print<>(&local_150," *\n");
    io::Printer::Print<>(&local_150," * @param array $data {\n");
    io::Printer::Print<>(&local_150," *     Optional. Data for populating the Message object.\n");
    io::Printer::Print<>(&local_150," *\n");
    if (0 < *(int *)(file + 4)) {
      lVar5 = 0;
      lVar10 = 0;
      do {
        lVar12 = *(long *)(file + 0x28);
        pFVar9 = (FieldDescriptor *)(lVar12 + lVar5);
        (anonymous_namespace)::PhpSetterTypeName_abi_cxx11_
                  ((string *)local_280,(_anonymous_namespace_ *)pFVar9,(FieldDescriptor *)message,
                   (Options *)options_01);
        pcVar11 = "var";
        options_01 = (Printer *)local_280;
        io::Printer::Print<char[9],std::__cxx11::string,char[4],std::__cxx11::string>
                  (&local_150," *     @type ^php_type^ $^var^\n",(char (*) [9])"php_type",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                   (char (*) [4])0x3f0b75,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar12 + 8 + lVar5));
        if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
          operator_delete((void *)local_280._0_8_);
        }
        local_280._16_8_ = &local_260;
        local_280._24_8_ = 0;
        local_260._M_local_buf[0] = '\0';
        local_250._M_p = local_248 + 8;
        local_248._0_8_ = 0;
        local_248[8] = '\0';
        local_230[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_230[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_230[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar3 = FieldDescriptor::GetSourceLocation(pFVar9,(SourceLocation *)local_280);
        if (bVar3) {
          options_01 = (Printer *)0xa;
          GenerateDocCommentBodyForLocation
                    ((anon_unknown_2 *)&local_150,(Printer *)local_280,(SourceLocation *)0x0,true,
                     (int)pcVar11);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_230);
        if (local_250._M_p != local_248 + 8) {
          operator_delete(local_250._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._16_8_ != &local_260) {
          operator_delete((void *)local_280._16_8_);
        }
        lVar10 = lVar10 + 1;
        lVar5 = lVar5 + 0x48;
      } while (lVar10 < *(int *)(file + 4));
    }
    io::Printer::Print<>(&local_150," * }\n");
    io::Printer::Print<>(&local_150," */\n");
    io::Printer::Print<>(&local_150,"public function __construct($data = NULL) {\n");
    io::Printer::Indent(&local_150);
    io::Printer::Indent(&local_150);
    (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)this,(FileDescriptor *)message,
               (Options *)options_01);
    FilenameToClassname(&local_70,&local_50);
    io::Printer::Print<char[9],std::__cxx11::string>
              (&local_150,"\\^fullname^::initOnce();\n",(char (*) [9])"fullname",&local_70);
    io::Printer::Print<>(&local_150,"parent::__construct($data);\n");
    io::Printer::Outdent(&local_150);
    io::Printer::Outdent(&local_150);
    io::Printer::Print<>(&local_150,"}\n\n");
    if (0 < *(int *)(file + 4)) {
      lVar5 = 0;
      lVar10 = 0;
      do {
        GenerateFieldAccessor
                  ((FieldDescriptor *)(*(long *)(file + 0x28) + lVar5),(Options *)message,&local_150
                  );
        lVar10 = lVar10 + 1;
        lVar5 = lVar5 + 0x48;
      } while (lVar10 < *(int *)(file + 4));
    }
    if (0 < *(int *)(file + 0x6c)) {
      lVar5 = 8;
      lVar10 = 0;
      do {
        lVar12 = *(long *)(file + 0x30);
        UnderscoresToCamelCase((string *)local_280,*(string **)(lVar12 + lVar5),true);
        pcVar11 = "name";
        io::Printer::Print<char[11],std::__cxx11::string,char[5],std::__cxx11::string>
                  (&local_150,
                   "/**\n * @return string\n */\npublic function get^camel_name^()\n{\n    return $this->whichOneof(\"^name^\");\n}\n\n"
                   ,(char (*) [11])"camel_name",(string *)local_280,(char (*) [5])0x3f58c9,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar12 + lVar5));
        if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
          operator_delete((void *)local_280._0_8_);
        }
        lVar10 = lVar10 + 1;
        lVar5 = lVar5 + 0x28;
      } while (lVar10 < *(int *)(file + 0x6c));
    }
    io::Printer::Outdent(&local_150);
    options_00 = local_158;
    io::Printer::Outdent(&local_150);
    io::Printer::Print<>(&local_150,"}\n\n");
    if (*(long *)(file + 0x18) != 0) {
      io::Printer::Print<>
                (&local_150,
                 "// Adding a class alias for backwards compatibility with the previous class name.\n"
                );
      LegacyFullClassName<google::protobuf::Descriptor>
                ((string *)local_280,(Descriptor *)file,(Options *)message);
      io::Printer::Print<char[4],std::__cxx11::string,char[4],std::__cxx11::string>
                (&local_150,"class_alias(^new^::class, \\^old^::class);\n\n",(char (*) [4])"new",
                 &local_178,(char (*) [4])"old",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280);
      if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
        operator_delete((void *)local_280._0_8_);
      }
      LegacyFullClassName<google::protobuf::Descriptor>
                ((string *)local_280,(Descriptor *)file,(Options *)message);
      if ((ZeroCopyOutputStream *)local_280._8_8_ != (ZeroCopyOutputStream *)0x0) {
        pZVar6 = (ZeroCopyOutputStream *)0x0;
        do {
          if (*(char *)(local_280._0_8_ + (long)pZVar6) == '\\') {
            *(char *)(local_280._0_8_ + (long)pZVar6) = '/';
          }
          pZVar6 = (ZeroCopyOutputStream *)((long)&pZVar6->_vptr_ZeroCopyOutputStream + 1);
        } while (pZVar6 < (ulong)local_280._8_8_);
      }
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,local_280._0_8_,
                 (pointer)(local_280._0_8_ + (long)(_func_int ***)local_280._8_8_));
      std::__cxx11::string::append((char *)&local_1e0);
      if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
        operator_delete((void *)local_280._0_8_);
      }
      pZVar6 = (ZeroCopyOutputStream *)
               (**(code **)(*(long *)options_00 + 0x10))(options_00,&local_1e0);
      io::Printer::Printer((Printer *)local_280,pZVar6,'^');
      io::Printer::Print<char[9],std::__cxx11::string>
                ((Printer *)local_280,
                 "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
                 ,(char (*) [9])"filename",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this);
      RootPhpNamespace<google::protobuf::Descriptor>
                ((string *)local_1c0,(Descriptor *)file,(Options *)message);
      if (local_1c0._8_8_ != 0) {
        io::Printer::Print<char[5],std::__cxx11::string>
                  ((Printer *)local_280,"namespace ^name^;\n\n",(char (*) [5])0x3f58c9,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0);
      }
      FullClassName<google::protobuf::Descriptor>(&local_90,(Descriptor *)file,(Options *)message);
      io::Printer::Print<>((Printer *)local_280,"if (false) {\n");
      io::Printer::Indent((Printer *)local_280);
      io::Printer::Indent((Printer *)local_280);
      io::Printer::Print<>((Printer *)local_280,"/**\n");
      io::Printer::Print<char[4],std::__cxx11::string>
                ((Printer *)local_280," * This class is deprecated. Use ^new^ instead.\n",
                 (char (*) [4])"new",&local_90);
      io::Printer::Print<>((Printer *)local_280," * @deprecated\n");
      io::Printer::Print<>((Printer *)local_280," */\n");
      LegacyGeneratedClassName<google::protobuf::Descriptor>(&local_198,(Descriptor *)file);
      io::Printer::Print<char[4],std::__cxx11::string>
                ((Printer *)local_280,"class ^old^ {}\n",(char (*) [4])"old",&local_198);
      paVar1 = &local_198.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar1) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      io::Printer::Outdent((Printer *)local_280);
      io::Printer::Outdent((Printer *)local_280);
      io::Printer::Print<>((Printer *)local_280,"}\n");
      GeneratedClassNameImpl<google::protobuf::Descriptor>(&local_198,(Descriptor *)file);
      io::Printer::Print<char[4],std::__cxx11::string>
                ((Printer *)local_280,"class_exists(^new^::class);\n",(char (*) [4])"new",&local_198
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar1) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      LegacyFullClassName<google::protobuf::Descriptor>
                (&local_198,(Descriptor *)file,(Options *)message);
      pcVar11 = "fullname";
      io::Printer::Print<char[4],std::__cxx11::string,char[9],std::__cxx11::string>
                ((Printer *)local_280,
                 "@trigger_error(\'^old^ is deprecated and will be removed in the next major release. Use ^fullname^ instead\', E_USER_DEPRECATED);\n\n"
                 ,(char (*) [4])"old",&local_198,(char (*) [9])"fullname",&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar1) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((FieldDescriptor *)local_1c0._0_8_ != (FieldDescriptor *)(local_1c0 + 0x10)) {
        operator_delete((void *)local_1c0._0_8_);
      }
      io::Printer::~Printer((Printer *)local_280);
      if (pZVar6 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar6->_vptr_ZeroCopyOutputStream[1])(pZVar6);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
    }
    if (0 < *(int *)(file + 0x70)) {
      lVar5 = 0;
      lVar10 = 0;
      do {
        GenerateMessageFile(this,(FileDescriptor *)(*(long *)(file + 0x38) + lVar5),message,
                            options_00,(GeneratorContext *)pcVar11);
        lVar10 = lVar10 + 1;
        lVar5 = lVar5 + 0x88;
      } while (lVar10 < *(int *)(file + 0x70));
    }
    if (0 < *(int *)(file + 0x74)) {
      lVar5 = 0;
      lVar10 = 0;
      do {
        GenerateEnumFile(this,(FileDescriptor *)(*(long *)(file + 0x40) + lVar5),
                         (EnumDescriptor *)message,options_00,(GeneratorContext *)pcVar11);
        lVar10 = lVar10 + 1;
        lVar5 = lVar5 + 0x48;
      } while (lVar10 < *(int *)(file + 0x74));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    io::Printer::~Printer(&local_150);
    if (local_1a0 != (ZeroCopyOutputStream *)0x0) {
      (*local_1a0->_vptr_ZeroCopyOutputStream[1])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void GenerateMessageFile(const FileDescriptor* file, const Descriptor* message,
                         const Options& options,
                         GeneratorContext* generator_context) {
  // Don't generate MapEntry messages -- we use the PHP extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }

  std::string filename = GeneratedClassFileName(message, options);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (lastindex != std::string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));
  }

  GenerateUseDeclaration(options, &printer);

  GenerateMessageDocComment(&printer, message, options);
  if (lastindex != std::string::npos) {
    fullname = fullname.substr(lastindex + 1);
  }

  std::string base;

  switch (message->well_known_type()) {
    case Descriptor::WELLKNOWNTYPE_ANY:
      base = "\\Google\\Protobuf\\Internal\\AnyBase";
      break;
    case Descriptor::WELLKNOWNTYPE_TIMESTAMP:
      base = "\\Google\\Protobuf\\Internal\\TimestampBase";
      break;
    default:
      base = "\\Google\\Protobuf\\Internal\\Message";
      break;
  }

  printer.Print(
      "class ^name^ extends ^base^\n"
      "{\n",
      "base", base,
      "name", fullname);
  Indent(&printer);

  // Field and oneof definitions.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateField(field, &printer, options);
  }
  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    GenerateOneofField(oneof, &printer);
  }
  printer.Print("\n");

  GenerateMessageConstructorDocComment(&printer, message, options);
  printer.Print(
      "public function __construct($data = NULL) {\n");
  Indent(&printer);

  std::string metadata_filename = GeneratedMetadataFileName(file, options);
  std::string metadata_fullname = FilenameToClassname(metadata_filename);
  printer.Print(
      "\\^fullname^::initOnce();\n",
      "fullname", metadata_fullname);

  printer.Print(
      "parent::__construct($data);\n");

  Outdent(&printer);
  printer.Print("}\n\n");

  // Field and oneof accessors.
  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    GenerateFieldAccessor(field, options, &printer);
  }
  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    printer.Print(
      "/**\n"
      " * @return string\n"
      " */\n"
      "public function get^camel_name^()\n"
      "{\n"
      "    return $this->whichOneof(\"^name^\");\n"
      "}\n\n",
      "camel_name", UnderscoresToCamelCase(oneof->name(), true), "name",
      oneof->name());
  }

  Outdent(&printer);
  printer.Print("}\n\n");

  // write legacy file for backwards compatibility with nested messages and enums
  if (message->containing_type() != NULL) {
    printer.Print(
        "// Adding a class alias for backwards compatibility with the previous class name.\n");
    printer.Print(
        "class_alias(^new^::class, \\^old^::class);\n\n",
        "new", fullname,
        "old", LegacyFullClassName(message, options));
    LegacyGenerateClassFile(file, message, options, generator_context);
  }

  // Nested messages and enums.
  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageFile(file, message->nested_type(i), options,
                        generator_context);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumFile(file, message->enum_type(i), options, generator_context);
  }
}